

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week12-app2.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  size_t in_RDX;
  size_t extraout_RDX;
  string s2;
  string s1;
  string local_48;
  string local_28;
  
  operator____s_abi_cxx11_(&local_28,"Hello",in_RDX);
  operator____s_abi_cxx11_(&local_48,"Hello",extraout_RDX);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator==(&local_28,&local_48);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

int main(int, char* [])
{
//    const char* s1 = "Hello";
//    const char* s2 = "Hello";

    auto i = 10; // integer
    auto d = 10.5; // double
    auto f = 20.3f; // float
    auto li = 10l;
    auto s1 = "Hello"_s; //  std::string("Hello");
    auto s2 = "Hello"_s;
    std::cout << (size_t)&s1[0] << std::endl;
    std::cout << (size_t)&s2[0] << std::endl;
    std::cout << (s1 == s2) << std::endl;

    return 0;
}